

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::AttachedComment::~AttachedComment(AttachedComment *this)

{
  AttachedComment *this_local;
  
  ~AttachedComment(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit AttachedComment(std::string str)
      : IRInst(InstType::AttachedComment), str(std::move(str)) {}